

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

void __thiscall filesystem::path::set(path *this,string *str,path_type type)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  bool local_e1;
  bool local_c9;
  allocator local_a9;
  string local_a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  allocator local_59;
  string local_58 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  path_type local_1c;
  string *psStack_18;
  path_type type_local;
  string *str_local;
  path *this_local;
  
  this->m_type = type;
  local_1c = type;
  psStack_18 = str;
  str_local = (string *)this;
  if (type == windows_path) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"/\\",&local_59);
    tokenize(&local_38,str,(string *)local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_path,&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    uVar3 = std::__cxx11::string::size();
    local_c9 = false;
    if (1 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
      iVar1 = isalpha((int)*pcVar4);
      local_c9 = false;
      if (iVar1 != 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
        local_c9 = *pcVar4 == ':';
      }
    }
    this->m_absolute = local_c9;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"/",&local_a9);
    tokenize(&local_88,str,(string *)local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_path,&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    uVar2 = std::__cxx11::string::empty();
    local_e1 = false;
    if ((uVar2 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
      local_e1 = *pcVar4 == '/';
    }
    this->m_absolute = local_e1;
  }
  return;
}

Assistant:

void set(const std::string &str, path_type type = native_path) {
        m_type = type;
        if (type == windows_path) {
            m_path = tokenize(str, "/\\");
            m_absolute = str.size() >= 2 && std::isalpha(str[0]) && str[1] == ':';
        } else {
            m_path = tokenize(str, "/");
            m_absolute = !str.empty() && str[0] == '/';
        }
    }